

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O0

string * directories::MADPGetProblemFilename(string *problem)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  char *__name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  E *pEVar5;
  size_type sVar6;
  ostream *poVar7;
  stringstream *arg;
  string *in_RSI;
  string *in_RDI;
  stringstream ss;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  dirent *ep;
  string problemName;
  DIR *d;
  size_t pos;
  value_type *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  dirent *in_stack_fffffffffffffc90;
  allocator<char> *__rhs;
  char *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  E *in_stack_fffffffffffffcb0;
  string *__s;
  stringstream local_318 [16];
  ostream local_308 [380];
  int local_18c;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  undefined1 local_b1 [33];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  dirent *local_78;
  string local_70 [32];
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  ulong local_28;
  string *local_10;
  
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  uVar2 = std::__cxx11::string::find_last_of((char *)local_10,0xbdc5a8);
  local_28 = uVar2;
  lVar4 = std::__cxx11::string::length();
  if ((uVar2 < lVar4 - 1U) && (local_28 != 0)) {
    std::__cxx11::string::string((string *)in_RDI,local_10);
  }
  else {
    __s = local_50;
    MADPGetProblemsDir_abi_cxx11_();
    __name = (char *)std::__cxx11::string::c_str();
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)opendir(__name);
    std::__cxx11::string::~string(local_50);
    local_30 = this;
    if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pEVar5 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar5,in_stack_fffffffffffffca8);
      __cxa_throw(pEVar5,&E::typeinfo,E::~E);
    }
    std::__cxx11::string::string(local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x8e9eb7);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)__s,(allocator<char> *)in_stack_fffffffffffffcb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    __rhs = &local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)__s,(allocator<char> *)in_stack_fffffffffffffcb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)__s,(allocator<char> *)in_stack_fffffffffffffcb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::operator=(local_70,local_10);
    do {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_90);
      if (sVar6 == 0) {
        closedir((DIR *)local_30);
        local_18c = 0;
        break;
      }
      std::operator+(__lhs,(char *)__rhs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc80);
      std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      std::__cxx11::string::~string(local_148);
      do {
        in_stack_fffffffffffffc90 = readdir((DIR *)local_30);
        local_78 = in_stack_fffffffffffffc90;
        if (in_stack_fffffffffffffc90 == (dirent *)0x0) {
          rewinddir((DIR *)local_30);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x8ea2ba);
          local_18c = 0;
          goto LAB_008ea2c5;
        }
        iVar1 = std::__cxx11::string::compare((char *)local_128);
      } while (iVar1 != 0);
      closedir((DIR *)local_30);
      MADPGetProblemsDir_abi_cxx11_();
      std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_188);
      local_18c = 1;
LAB_008ea2c5:
      std::__cxx11::string::~string(local_128);
    } while (local_18c == 0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc90);
    std::__cxx11::string::~string(local_70);
    if (local_18c == 0) {
      std::__cxx11::stringstream::stringstream(local_318);
      poVar7 = std::operator<<(local_308,"Problem file not found (problem = ");
      pEVar5 = (E *)std::operator<<(poVar7,local_10);
      std::operator<<((ostream *)pEVar5,")");
      arg = (stringstream *)__cxa_allocate_exception(0x28);
      E::E(pEVar5,arg);
      __cxa_throw(arg,&E::typeinfo,E::~E);
    }
  }
  return in_RDI;
}

Assistant:

string directories::MADPGetProblemFilename(const string & problem)
{
    if (problem.empty())
        throw(E("No problem file specified."));

    size_t pos = problem.find_last_of(".");

    if(pos < problem.length()-1 && pos > 0){ //non-empty extension
        return(problem);
    }else{
        DIR *d = opendir (MADPGetProblemsDir().c_str());
	if (d == NULL)
	    throw(E("Could not open problems directory. Please create a symbolic link from ~/.madp/problems to the problems directory in your MADP tree (see README for details)."));

	string problemName;
        struct dirent *ep;
        vector<string> extensions; //default extensions. Add more here if needed.
        extensions.push_back("pgmx"); 
        extensions.push_back("dpomdp");
        extensions.push_back("POMDP");
        problemName = problem;
        while(extensions.size() > 0)
        {
            string s = problemName + "." + extensions.back();
            while ((ep = readdir (d)))
            {
                if(!s.compare(ep->d_name))
	        {
                    closedir (d);
                    return(MADPGetProblemsDir() + "/" + s);
	        }
            }
            rewinddir (d);
            extensions.pop_back();
        }
	closedir (d);
    }

    stringstream ss;
    ss << "Problem file not found (problem = " << problem << ")";
    throw(E(ss));
    return(problem);
}